

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O3

exr_result_t validate_channels(exr_context_t f,exr_priv_part_t curpart)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  exr_attribute_t *peVar5;
  exr_attr_chlist_entry_t *peVar6;
  exr_result_t eVar7;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr *UNRECOVERED_JUMPTABLE_00;
  long lVar8;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  undefined8 uVar9;
  char *pcVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  peVar5 = curpart->channels;
  if (peVar5 == (exr_attribute_t *)0x0) {
    UNRECOVERED_JUMPTABLE = f->print_error;
    pcVar10 = "\'channels\' attribute not found";
    eVar7 = 0xd;
  }
  else {
    if (peVar5->type == EXR_ATTR_CHLIST) {
      if (curpart->dataWindow == (exr_attribute_t *)0x0) {
        UNRECOVERED_JUMPTABLE_00 = f->report_error;
        pcVar10 = "request to validate channel list, but data window not set to validate against";
        eVar7 = 0xf;
      }
      else {
        lVar8 = (long)((peVar5->field_6).chlist)->num_channels;
        if (0 < lVar8) {
          iVar1 = (curpart->data_window).min.x;
          uVar11 = (ulong)iVar1;
          uVar2 = (curpart->data_window).min.y;
          lVar13 = ((long)(curpart->data_window).max.x - uVar11) + 1;
          lVar14 = ((long)(curpart->data_window).max.y - (long)(int)uVar2) + 1;
          peVar6 = ((peVar5->field_6).chlist)->entries;
          lVar15 = 0;
          while( true ) {
            uVar3 = *(uint *)(peVar6->reserved + lVar15 + 3);
            if ((long)(int)uVar3 < 1) {
              eVar7 = (*f->print_error)(f,0xe,"channel \'%s\': x subsampling factor is invalid (%d)"
                                        ,*(undefined8 *)(peVar6->reserved + lVar15 + -0xd),
                                        (ulong)uVar3,f->print_error);
              return eVar7;
            }
            uVar4 = *(uint *)(peVar6->reserved + lVar15 + 7);
            uVar12 = (ulong)uVar4;
            if ((int)uVar4 < 1) {
              eVar7 = (*f->print_error)(f,0xe,"channel \'%s\': y subsampling factor is invalid (%d)"
                                        ,*(undefined8 *)(peVar6->reserved + lVar15 + -0xd),
                                        (ulong)uVar4);
              return eVar7;
            }
            if (iVar1 % (int)uVar3 != 0) break;
            if ((int)uVar2 % (int)uVar4 != 0) {
              UNRECOVERED_JUMPTABLE = f->print_error;
              uVar9 = *(undefined8 *)(peVar6->reserved + lVar15 + -0xd);
              pcVar10 = 
              "channel \'%s\': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)"
              ;
              uVar11 = (ulong)uVar2;
              goto LAB_00133660;
            }
            if (lVar13 % (long)(int)uVar3 != 0) {
              UNRECOVERED_JUMPTABLE = f->print_error;
              uVar9 = *(undefined8 *)(peVar6->reserved + lVar15 + -0xd);
              pcVar10 = 
              "channel \'%s\': row width (%ld) of the data window is not a multiple of the x subsampling factor (%d)"
              ;
              uVar12 = (ulong)uVar3;
LAB_001336a6:
              eVar7 = (*UNRECOVERED_JUMPTABLE)(f,0xe,pcVar10,uVar9,lVar13,uVar12);
              return eVar7;
            }
            if (lVar14 % (long)uVar12 != 0) {
              UNRECOVERED_JUMPTABLE = f->print_error;
              uVar9 = *(undefined8 *)(peVar6->reserved + lVar15 + -0xd);
              pcVar10 = 
              "channel \'%s\': column height (%ld) of the data window is not a multiple of the y subsampling factor (%d)"
              ;
              lVar13 = lVar14;
              goto LAB_001336a6;
            }
            lVar15 = lVar15 + 0x20;
            if (lVar8 * 0x20 == lVar15) {
              return 0;
            }
          }
          UNRECOVERED_JUMPTABLE = f->print_error;
          uVar9 = *(undefined8 *)(peVar6->reserved + lVar15 + -0xd);
          pcVar10 = 
          "channel \'%s\': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)"
          ;
          uVar12 = (ulong)uVar3;
LAB_00133660:
          eVar7 = (*UNRECOVERED_JUMPTABLE)(f,0xe,pcVar10,uVar9,uVar11,uVar12);
          return eVar7;
        }
        UNRECOVERED_JUMPTABLE_00 = f->report_error;
        pcVar10 = "At least one channel required";
        eVar7 = 6;
      }
      eVar7 = (*UNRECOVERED_JUMPTABLE_00)(f,eVar7,pcVar10);
      return eVar7;
    }
    UNRECOVERED_JUMPTABLE = f->print_error;
    pcVar10 = "\'channels\' attribute has wrong data type, expect chlist";
    eVar7 = 0x10;
  }
  eVar7 = (*UNRECOVERED_JUMPTABLE)(f,eVar7,pcVar10,UNRECOVERED_JUMPTABLE);
  return eVar7;
}

Assistant:

static exr_result_t
validate_channels (
    exr_context_t f, exr_priv_part_t curpart)
{
    exr_attr_box2i_t         dw;
    int64_t                  w, h;
    const exr_attr_chlist_t* channels;

    if (!curpart->channels)
        return f->print_error (
            f, EXR_ERR_MISSING_REQ_ATTR, "'channels' attribute not found");
    else if (curpart->channels->type != EXR_ATTR_CHLIST)
        return f->print_error (
            f,
            EXR_ERR_ATTR_TYPE_MISMATCH,
            "'channels' attribute has wrong data type, expect chlist");

    channels = curpart->channels->chlist;

    if (!curpart->dataWindow)
        return f->report_error (
            f,
            EXR_ERR_NO_ATTR_BY_NAME,
            "request to validate channel list, but data window not set to validate against");

    if (channels->num_channels <= 0)
        return f->report_error (
            f, EXR_ERR_FILE_BAD_HEADER, "At least one channel required");

    dw = curpart->data_window;
    w  = (int64_t) dw.max.x - (int64_t) dw.min.x + 1;
    h  = (int64_t) dw.max.y - (int64_t) dw.min.y + 1;

    for (int c = 0; c < channels->num_channels; ++c)
    {
        int32_t xsamp = channels->entries[c].x_sampling;
        int32_t ysamp = channels->entries[c].y_sampling;

        if (xsamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': x subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                xsamp);
        if (ysamp < 1)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': y subsampling factor is invalid (%d)",
                channels->entries[c].name.str,
                ysamp);
        if (dw.min.x % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum x coordinate (%d) of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.x,
                xsamp);
        if (dw.min.y % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': minimum y coordinate (%d) of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                dw.min.y,
                ysamp);
        if (w % xsamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': row width (%" PRId64
                ") of the data window is not a multiple of the x subsampling factor (%d)",
                channels->entries[c].name.str,
                w,
                xsamp);
        if (h % ysamp)
            return f->print_error (
                f,
                EXR_ERR_INVALID_ATTR,
                "channel '%s': column height (%" PRId64
                ") of the data window is not a multiple of the y subsampling factor (%d)",
                channels->entries[c].name.str,
                h,
                ysamp);
    }

    return EXR_ERR_SUCCESS;
}